

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O0

int pub0_sock_set_sendbuf(void *arg,void *buf,size_t sz,nni_type t)

{
  int local_48;
  int local_44;
  int rv;
  int val;
  pub0_pipe *p;
  pub0_sock *sock;
  size_t sStack_28;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  p = (pub0_pipe *)arg;
  sock._4_4_ = t;
  sStack_28 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  local_48 = nni_copyin_int(&local_44,buf,sz,1,0x2000,t);
  arg_local._4_4_ = local_48;
  if (local_48 == 0) {
    nni_mtx_lock((nni_mtx *)&(p->sendq).lmq_alloc);
    (p->sendq).lmq_buf[0] = (nng_msg *)(long)local_44;
    _rv = nni_list_first((nni_list *)p);
    while ((_rv != (void *)0x0 &&
           (local_48 = nni_lmq_resize((nni_lmq *)((long)_rv + 0x10),(long)local_44), local_48 == 0))
          ) {
      _rv = nni_list_next((nni_list *)p,_rv);
    }
    nni_mtx_unlock((nni_mtx *)&(p->sendq).lmq_alloc);
    arg_local._4_4_ = local_48;
  }
  return arg_local._4_4_;
}

Assistant:

static int
pub0_sock_set_sendbuf(void *arg, const void *buf, size_t sz, nni_type t)
{
	pub0_sock *sock = arg;
	pub0_pipe *p;
	int        val;
	int        rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 1, 8192, t)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&sock->mtx);
	sock->sendbuf = (size_t) val;
	NNI_LIST_FOREACH (&sock->pipes, p) {
		// If we fail part way through (should only be ENOMEM), we
		// stop short.  The others would likely fail for ENOMEM as
		// well anyway.  There is a weird effect here where the
		// buffers may have been set for *some* of the pipes, but
		// we have no way to correct partial failure.
		if ((rv = nni_lmq_resize(&p->sendq, (size_t) val)) != 0) {
			break;
		}
	}
	nni_mtx_unlock(&sock->mtx);
	return (rv);
}